

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmbiftio.cpp
# Opt level: O0

void CVmBifTIO::log_console_close(uint argc)

{
  CVmConsole *this;
  int in_EDI;
  CVmLogConsoleManager *unaff_retaddr;
  CVmConsole *console;
  int handle;
  vm_nl_type in_stack_ffffffffffffffec;
  CVmLogConsoleManager *in_stack_fffffffffffffff0;
  
  CVmBif::check_argc(0,0x2b08c6);
  CVmBif::pop_int_val();
  CVmConsoleMain::get_log_console_manager(G_console_X);
  this = (CVmConsole *)
         CVmLogConsoleManager::get_console(in_stack_fffffffffffffff0,in_stack_ffffffffffffffec);
  if (this == (CVmConsole *)0x0) {
    err_throw(0);
  }
  CVmConsole::flush(this,in_stack_ffffffffffffffec);
  CVmConsoleMain::get_log_console_manager(G_console_X);
  CVmLogConsoleManager::delete_log_console(unaff_retaddr,in_EDI);
  CVmBif::retval_nil();
  return;
}

Assistant:

void CVmBifTIO::log_console_close(VMG_ uint argc)
{
    int handle;
    CVmConsole *console;
    
    /* check arguments */
    check_argc(vmg_ argc, 1);

    /* get the handle */
    handle = pop_int_val(vmg0_);

    /* get the console based on the handle */
    console = G_console->get_log_console_manager()->get_console(handle);
    if (console == 0)
        err_throw(VMERR_BAD_VAL_BIF);

    /* flush the console */
    console->flush(vmg_ VM_NL_NONE);

    /* delete the console */
    G_console->get_log_console_manager()->delete_log_console(vmg_ handle);

    /* no return value */
    retval_nil(vmg0_);
}

/*
 *   write values to a log console
 */
void CVmBifTIO::log_console_say(VMG_ uint argc)
{
    int hdl;
    CVmConsole *console;

    /* check arguments */
    check_argc_range(vmg_ argc, 1, 32767);

    /* get the console handle */
    hdl = pop_int_val(vmg0_);

    /* 
     *   if it's the special value -1, it means that we want to write to the
     *   main console's log file; otherwise, it's a log console that we
     *   previously created explicitly via log_console_create()
     */
    if (hdl == -1)
    {
        /* use the main log */
        console = new CVmConsoleMainLog();
    }
    else
    {
        /* get the console by handle - if it's invalid, throw an error */
        console = G_console->get_log_console_manager()->get_console(hdl);
        if (console == 0)
            err_throw(VMERR_BAD_VAL_BIF);
    }

    /*
     *   write the argument(s) to the console (note that the first argument,
     *   which we've already retrieved, is the console handle, so don't count
     *   it among the arguments to display) 
     */
    err_try
    {
        say_to_console(vmg_ console, argc - 1);
    }
    err_finally
    {
        /* if we created a "main console" object, we're done with it */
        if (hdl == -1)
            console->delete_obj(vmg0_);
    }